

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# count128_lcg_shift.hpp
# Opt level: O0

basic_istream<char,_std::char_traits<char>_> *
trng::operator>>(basic_istream<char,_std::char_traits<char>_> *in,count128_lcg_shift *R)

{
  delim_c dVar1;
  delim_c dVar2;
  bool bVar3;
  fmtflags __fmtfl;
  _Ios_Fmtflags _Var4;
  basic_istream<char,_std::char_traits<char>_> *this;
  undefined8 *in_RSI;
  basic_istream<char,_std::char_traits<char>_> *in_RDI;
  fmtflags flags;
  status_type S_new;
  parameter_type P_new;
  parameter_type *in_stack_ffffffffffffff70;
  basic_istream<char,_std::char_traits<char>_> *in_00;
  delim_str *in_stack_ffffffffffffff88;
  basic_istream<char,_std::char_traits<char>_> *in_stack_ffffffffffffff90;
  status_type *in_stack_ffffffffffffff98;
  undefined5 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa5;
  parameter_type *in_stack_ffffffffffffffb8;
  basic_istream<char,_std::char_traits<char>_> *in_stack_ffffffffffffffc0;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  
  count128_lcg_shift::parameter_type::parameter_type(in_stack_ffffffffffffff70);
  count128_lcg_shift::status_type::status_type((status_type *)0x28e45b);
  __fmtfl = Catch::clara::std::ios_base::flags
                      ((ios_base *)(in_RDI + *(long *)(*(long *)in_RDI + -0x18)));
  this = in_RDI + *(long *)(*(long *)in_RDI + -0x18);
  _Var4 = Catch::clara::std::operator|(_S_dec,_S_fixed);
  _Var4 = Catch::clara::std::operator|(_Var4,_S_left);
  Catch::clara::std::ios_base::flags((ios_base *)this,_Var4);
  in_00 = in_RDI;
  utility::ignore_spaces();
  utility::operator>>(in_00,(ignore_spaces_cl *)this);
  utility::delim('\0');
  utility::operator>>(in_00,(delim_c *)this);
  count128_lcg_shift::name();
  utility::delim((char *)this);
  utility::operator>>(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  dVar1 = utility::delim('\0');
  utility::operator>>(in_00,(delim_c *)this);
  operator>>(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  dVar2 = utility::delim('\0');
  utility::operator>>(in_00,(delim_c *)this);
  operator>>((basic_istream<char,_std::char_traits<char>_> *)
             CONCAT17(dVar1.c,CONCAT16(dVar2.c,CONCAT15(in_stack_ffffffffffffffa5,
                                                        in_stack_ffffffffffffffa0))),
             in_stack_ffffffffffffff98);
  utility::delim('\0');
  utility::operator>>(in_00,(delim_c *)this);
  bVar3 = std::ios::operator_cast_to_bool((ios *)(in_RDI + *(long *)(*(long *)in_RDI + -0x18)));
  if (bVar3) {
    *in_RSI = local_38;
    in_RSI[1] = local_30;
    in_RSI[2] = local_28;
    in_RSI[3] = local_20;
    in_RSI[4] = in_stack_ffffffffffffffb8;
    in_RSI[5] = in_stack_ffffffffffffffc0;
  }
  Catch::clara::std::ios_base::flags
            ((ios_base *)(in_RDI + *(long *)(*(long *)in_RDI + -0x18)),__fmtfl);
  return in_RDI;
}

Assistant:

std::basic_istream<char_t, traits_t> &operator>>(
        std::basic_istream<char_t, traits_t> &in, count128_lcg_shift &R) {
      count128_lcg_shift::parameter_type P_new;
      count128_lcg_shift::status_type S_new;
      std::ios_base::fmtflags flags(in.flags());
      in.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
      in >> utility::ignore_spaces();
      in >> utility::delim('[') >> utility::delim(count128_lcg_shift::name()) >>
          utility::delim(' ') >> P_new >> utility::delim(' ') >> S_new >> utility::delim(']');
      if (in) {
        R.P = P_new;
        R.S = S_new;
      }
      in.flags(flags);
      return in;
    }